

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.h
# Opt level: O2

void __thiscall
slang::ast::SolveBeforeConstraint::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (SolveBeforeConstraint *this,MonitorVisitor *visitor)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  
  ppEVar1 = (this->solve)._M_ptr;
  sVar2 = (this->solve)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<slang::ast::builtins::MonitorVisitor&>
              (*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  ppEVar1 = (this->after)._M_ptr;
  sVar2 = (this->after)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<slang::ast::builtins::MonitorVisitor&>
              (*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto item : solve)
            item->visit(visitor);
        for (auto item : after)
            item->visit(visitor);
    }